

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  int _c;
  float fVar7;
  int local_90;
  Mat local_70;
  
  iVar4 = bottom_blob->dims;
  if (iVar4 == 3) {
    iVar4 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    _c = bottom_blob->c;
    Mat::create(top_blob,iVar4,iVar1,_c,1,opt->blob_allocator);
    local_90 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar6 = iVar1 * iVar4;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      local_90 = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (iVar4 = 0; iVar4 != _c; iVar4 = iVar4 + 1) {
        Mat::channel(&local_70,bottom_blob,iVar4);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,top_blob,iVar4);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          fVar7 = roundf(this->scale * *(float *)((long)pvVar2 + uVar5 * 4));
          if (fVar7 <= -128.0) {
            fVar7 = -128.0;
          }
          if (127.0 <= fVar7) {
            fVar7 = 127.0;
          }
          *(char *)((long)pvVar3 + uVar5) = (char)(int)fVar7;
        }
      }
    }
  }
  else if (iVar4 == 2) {
    iVar4 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    Mat::create(top_blob,iVar4,iVar1,1,opt->blob_allocator);
    pvVar2 = top_blob->data;
    local_90 = -100;
    if ((pvVar2 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar6 = iVar1 * iVar4;
      local_90 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      pvVar3 = bottom_blob->data;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        fVar7 = roundf(this->scale * *(float *)((long)pvVar3 + uVar5 * 4));
        if (fVar7 <= -128.0) {
          fVar7 = -128.0;
        }
        if (127.0 <= fVar7) {
          fVar7 = 127.0;
        }
        *(char *)((long)pvVar2 + uVar5) = (char)(int)fVar7;
      }
    }
  }
  else {
    local_90 = 0;
    if (iVar4 == 1) {
      uVar6 = bottom_blob->w;
      Mat::create(top_blob,uVar6,1,opt->blob_allocator);
      pvVar2 = top_blob->data;
      local_90 = -100;
      if ((pvVar2 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_90 = 0;
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        pvVar3 = bottom_blob->data;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          fVar7 = roundf(this->scale * *(float *)((long)pvVar3 + uVar5 * 4));
          if (fVar7 <= -128.0) {
            fVar7 = -128.0;
          }
          if (127.0 <= fVar7) {
            fVar7 = 127.0;
          }
          *(char *)((long)pvVar2 + uVar5) = (char)(int)fVar7;
        }
      }
    }
  }
  return local_90;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}